

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

void __thiscall
mjs::interpreter::impl::force_global_scope::force_global_scope(force_global_scope *this,impl *i)

{
  gc_heap_ptr<mjs::interpreter::impl::scope> local_58 [2];
  gc_heap_ptr<mjs::object> local_38;
  object_ptr local_28;
  impl *local_18;
  impl *i_local;
  force_global_scope *this_local;
  
  this->parent_ = i;
  local_18 = i;
  i_local = (impl *)this;
  gc_heap_ptr<mjs::interpreter::impl::scope>::gc_heap_ptr
            (&this->old_scope_,&this->parent_->active_scope_);
  gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::global_object,void>(&local_38,&local_18->global_);
  gc_heap_ptr<mjs::interpreter::impl::scope>::gc_heap_ptr(local_58,(nullptr_t)0x0);
  make_scope(&local_28,(scope_ptr *)&local_38);
  gc_heap_ptr<mjs::interpreter::impl::scope>::operator=
            (&this->parent_->active_scope_,(gc_heap_ptr<mjs::interpreter::impl::scope> *)&local_28);
  gc_heap_ptr<mjs::interpreter::impl::scope>::~gc_heap_ptr
            ((gc_heap_ptr<mjs::interpreter::impl::scope> *)&local_28);
  gc_heap_ptr<mjs::interpreter::impl::scope>::~gc_heap_ptr(local_58);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_38);
  return;
}

Assistant:

explicit force_global_scope(impl& i) : parent_(i), old_scope_(parent_.active_scope_) {
            parent_.active_scope_ = make_scope(i.global_, nullptr);
        }